

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_avx2.c
# Opt level: O2

void randomx_argon2_fill_segment_avx2(argon2_instance_t *instance,argon2_position_t position)

{
  ulong uVar1;
  ulong uVar2;
  uint32_t uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  __m256i state [32];
  argon2_position_t local_470;
  longlong local_460 [134];
  
  local_470._8_8_ = position._8_8_;
  local_470._0_8_ = position._0_8_;
  if (instance != (argon2_instance_t *)0x0) {
    bVar8 = position.slice == 0 &&
            ((undefined1  [16])position & (undefined1  [16])0xffffffff) == (undefined1  [16])0x0;
    uVar3 = instance->segment_length;
    uVar5 = instance->lane_length;
    uVar6 = position.lane * uVar5 + (uint)bVar8 * 2 + position.slice * uVar3;
    uVar7 = (ulong)((-(uint)(uVar6 % uVar5 != 0) | uVar5 - 1) + uVar6);
    memcpy(local_460,instance->memory + uVar7,0x400);
    for (uVar5 = (uint)bVar8 * 2; uVar5 < uVar3; uVar5 = uVar5 + 1) {
      if (uVar6 % instance->lane_length == 1) {
        uVar7 = (ulong)(uVar6 - 1);
      }
      uVar1 = instance->memory[uVar7].v[0];
      uVar2 = (uVar1 >> 0x20) % (ulong)instance->lanes;
      uVar4 = uVar2;
      if (local_470.slice == '\0') {
        uVar4 = (ulong)local_470._0_8_ >> 0x20;
      }
      if (local_470.pass != 0) {
        uVar4 = uVar2;
      }
      local_470.index = uVar5;
      uVar3 = randomx_argon2_index_alpha
                        (instance,&local_470,(uint32_t)uVar1,
                         (uint)(uVar4 == (ulong)local_470._0_8_ >> 0x20));
      fill_block((__m256i *)local_460,
                 instance->memory + instance->lane_length * uVar4 + (ulong)uVar3,
                 instance->memory + uVar6,(uint)(local_470.pass != 0 && instance->version != 0x10));
      uVar6 = uVar6 + 1;
      uVar7 = (ulong)((int)uVar7 + 1);
      uVar3 = instance->segment_length;
    }
  }
  return;
}

Assistant:

void randomx_argon2_fill_segment_avx2(const argon2_instance_t* instance,
	argon2_position_t position) {
	block* ref_block = NULL, * curr_block = NULL;
	block address_block, input_block;
	uint64_t pseudo_rand, ref_index, ref_lane;
	uint32_t prev_offset, curr_offset;
	uint32_t starting_index, i;
	__m256i state[ARGON2_HWORDS_IN_BLOCK];

	if (instance == NULL) {
		return;
	}

	starting_index = 0;

	if ((0 == position.pass) && (0 == position.slice)) {
		starting_index = 2; /* we have already generated the first two blocks */
	}

	/* Offset of the current block */
	curr_offset = position.lane * instance->lane_length +
		position.slice * instance->segment_length + starting_index;

	if (0 == curr_offset % instance->lane_length) {
		/* Last block in this lane */
		prev_offset = curr_offset + instance->lane_length - 1;
	}
	else {
		/* Previous block */
		prev_offset = curr_offset - 1;
	}

	memcpy(state, ((instance->memory + prev_offset)->v), ARGON2_BLOCK_SIZE);

	for (i = starting_index; i < instance->segment_length;
		++i, ++curr_offset, ++prev_offset) {
		/*1.1 Rotating prev_offset if needed */
		if (curr_offset % instance->lane_length == 1) {
			prev_offset = curr_offset - 1;
		}

		/* 1.2 Computing the index of the reference block */
		/* 1.2.1 Taking pseudo-random value from the previous block */
		pseudo_rand = instance->memory[prev_offset].v[0];

		/* 1.2.2 Computing the lane of the reference block */
		ref_lane = ((pseudo_rand >> 32)) % instance->lanes;

		if ((position.pass == 0) && (position.slice == 0)) {
			/* Can not reference other lanes yet */
			ref_lane = position.lane;
		}

		/* 1.2.3 Computing the number of possible reference block within the
		 * lane.
		 */
		position.index = i;
		ref_index = randomx_argon2_index_alpha(instance, &position, pseudo_rand & 0xFFFFFFFF,
			ref_lane == position.lane);

		/* 2 Creating a new block */
		ref_block =
			instance->memory + instance->lane_length * ref_lane + ref_index;
		curr_block = instance->memory + curr_offset;
		if (ARGON2_VERSION_10 == instance->version) {
			/* version 1.2.1 and earlier: overwrite, not XOR */
			fill_block(state, ref_block, curr_block, 0);
		}
		else {
			if (0 == position.pass) {
				fill_block(state, ref_block, curr_block, 0);
			}
			else {
				fill_block(state, ref_block, curr_block, 1);
			}
		}
	}
}